

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

Point __thiscall Board::find_king(Board *this,Color color)

{
  bool bVar1;
  char cVar2;
  short y;
  int iVar3;
  undefined7 in_register_00000031;
  dimension x;
  Point local_68;
  Point local_64;
  Point local_60;
  Point local_5c;
  int local_58;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,color);
  iVar3 = 0;
  while (y = (short)iVar3, y != 8) {
    local_58 = iVar3;
    for (x = 0; x != 8; x = x + 1) {
      Point::Point(&local_5c,x,y);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_5c.m_x].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_5c.m_y * 0x10) != 0) {
        Point::Point(&local_60,x,y);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_60.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_60.m_y * 0x10) + 0x18))(&local_50);
        bVar1 = std::operator==(&local_50,"Kg");
        if (bVar1) {
          Point::Point(&local_64,x,y);
          cVar2 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                          
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_64.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                          + (long)local_64.m_y * 0x10) + 0x20))();
          std::__cxx11::string::~string((string *)&local_50);
          if (cVar2 == (char)local_54) goto LAB_00107841;
        }
        else {
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
    iVar3 = local_58 + 1;
  }
  y = -1;
  x = y;
LAB_00107841:
  Point::Point(&local_68,x,y);
  return local_68;
}

Assistant:

Point Board::find_king(Color color) const {
    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] != nullptr) && (m_board[{j, i}]->get_representation() == "Kg") &&
                (m_board[{j, i}]->get_color() == color)) {
                return Point(j, i);
            }
        }
    }

    return Point(-1, -1);
}